

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O0

void lua_settop(lua_State *L,int idx)

{
  TValue *pTVar1;
  int idx_local;
  lua_State *L_local;
  
  if (idx < 0) {
    L->top = L->top + (idx + 1);
  }
  else if (L->top < L->base + idx) {
    if ((TValue *)(L->maxstack).ptr64 <= L->base + idx) {
      lj_state_growstack(L,idx - (int)((long)L->top - (long)L->base >> 3));
    }
    do {
      pTVar1 = L->top;
      L->top = pTVar1 + 1;
      pTVar1->u64 = 0xffffffffffffffff;
    } while (L->top < L->base + idx);
  }
  else {
    L->top = L->base + idx;
  }
  return;
}

Assistant:

LUA_API void lua_settop(lua_State *L, int idx)
{
  if (idx >= 0) {
    lj_checkapi(idx <= tvref(L->maxstack) - L->base, "bad stack slot %d", idx);
    if (L->base + idx > L->top) {
      if (L->base + idx >= tvref(L->maxstack))
	lj_state_growstack(L, (MSize)idx - (MSize)(L->top - L->base));
      do { setnilV(L->top++); } while (L->top < L->base + idx);
    } else {
      L->top = L->base + idx;
    }
  } else {
    lj_checkapi(-(idx+1) <= (L->top - L->base), "bad stack slot %d", idx);
    L->top += idx+1;  /* Shrinks top (idx < 0). */
  }
}